

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::HUF_decompress4X2_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  long *plVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  long lVar4;
  long lVar5;
  BYTE *pStart;
  BYTE *pBVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *pBVar17;
  bool bVar18;
  HUF_DecompressFastArgs args;
  size_t local_e8;
  HUF_DecompressFastArgs local_c8;
  
  local_e8 = HUF_DecompressFastArgs_init(&local_c8,dst,dstSize,cSrc,cSrcSize,DTable);
  if (local_e8 - 1 < 0xffffffffffffff88) {
    pBVar6 = (BYTE *)((~((long)dstSize >> 0x3f) & dstSize) + (long)dst);
    HUF_decompress4X2_usingDTable_internal_fast_c_loop(&local_c8);
    uVar7 = dstSize + 3 >> 2;
    lVar9 = 0;
    while( true ) {
      uVar8 = (long)pBVar6 - (long)dst;
      dst = (BYTE *)((long)dst + uVar7);
      if (uVar8 < uVar7) {
        dst = pBVar6;
      }
      pBVar2 = local_c8.op[lVar9];
      local_e8 = 0xffffffffffffffec;
      if ((dst < pBVar2) ||
         (plVar11 = (long *)local_c8.ip[lVar9], plVar11 < local_c8.iend[lVar9] + -8)) break;
      lVar10 = *plVar11;
      uVar16 = 0;
      for (uVar8 = local_c8.bits[lVar9]; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000)
      {
        uVar16 = uVar16 + 1;
      }
      plVar1 = (long *)((long)local_c8.ilowest + 8);
      iVar12 = (int)local_c8.ilowest;
      pBVar17 = pBVar2;
      if ((ulong)((long)dst - (long)pBVar2) < 8) {
        if (plVar11 < plVar1) {
          if (plVar11 == (long *)local_c8.ilowest) goto LAB_012a5b2e;
          uVar15 = uVar16 >> 3 & 0x1fffffff;
          uVar8 = (ulong)(uint)((int)plVar11 - iVar12);
          if (local_c8.ilowest <= (long *)((long)plVar11 - uVar15)) {
            uVar8 = uVar15;
          }
          uVar14 = (uint)uVar16 + (int)uVar8 * -8;
        }
        else {
          uVar8 = uVar16 >> 3 & 0x1fffffff;
          uVar14 = (uint)uVar16 & 7;
        }
        uVar16 = (ulong)uVar14;
        plVar11 = (long *)((long)plVar11 - uVar8);
        lVar10 = *plVar11;
      }
      else {
        do {
          if (plVar11 < plVar1) {
            if (plVar11 == (long *)local_c8.ilowest) goto LAB_012a5b2e;
            uVar8 = uVar16 >> 3 & 0x1fffffff;
            bVar18 = local_c8.ilowest <= (long *)((long)plVar11 - uVar8);
            uVar14 = (int)plVar11 - iVar12;
            if (bVar18) {
              uVar14 = (uint)uVar8;
            }
            uVar13 = (uint)uVar16 + uVar14 * -8;
          }
          else {
            uVar14 = (uint)(uVar16 >> 3) & 0x1fffffff;
            uVar13 = (uint)uVar16 & 7;
            bVar18 = true;
          }
          uVar16 = (ulong)uVar13;
          plVar11 = (long *)((long)plVar11 - (ulong)uVar14);
          lVar10 = *plVar11;
          if (((BYTE *)((long)dst + -9) <= pBVar17) || (!bVar18)) goto LAB_012a5b2e;
          uVar8 = (ulong)(lVar10 << (uVar16 & 0x3f)) >> 0x35;
          *(short *)pBVar17 = (short)DTable[uVar8 + 1];
          uVar13 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar13;
          uVar16 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
          uVar8 = (ulong)(lVar10 << ((ulong)uVar13 & 0x3f)) >> 0x35;
          *(short *)(pBVar17 + uVar16) = (short)DTable[uVar8 + 1];
          uVar13 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar13;
          uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
          lVar4 = uVar8 + uVar16;
          uVar15 = (ulong)(lVar10 << ((ulong)uVar13 & 0x3f)) >> 0x35;
          *(short *)(pBVar17 + uVar8 + uVar16) = (short)DTable[uVar15 + 1];
          uVar13 = *(byte *)((long)DTable + uVar15 * 4 + 6) + uVar13;
          uVar8 = (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7);
          lVar5 = uVar8 + lVar4;
          uVar16 = (ulong)(lVar10 << ((ulong)uVar13 & 0x3f)) >> 0x35;
          *(short *)(pBVar17 + uVar8 + lVar4) = (short)DTable[uVar16 + 1];
          uVar13 = *(byte *)((long)DTable + uVar16 * 4 + 6) + uVar13;
          uVar8 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
          uVar15 = (ulong)(lVar10 << ((ulong)uVar13 & 0x3f)) >> 0x35;
          *(short *)(pBVar17 + uVar8 + lVar5) = (short)DTable[uVar15 + 1];
          uVar13 = *(byte *)((long)DTable + uVar15 * 4 + 6) + uVar13;
          uVar16 = (ulong)uVar13;
          pBVar17 = pBVar17 + (ulong)*(byte *)((long)DTable + uVar15 * 4 + 7) + uVar8 + lVar5;
        } while (uVar13 < 0x41);
        plVar11 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_012a5b2e:
      if (1 < (ulong)((long)dst - (long)pBVar17)) {
        while (uVar14 = (uint)uVar16, uVar14 < 0x41) {
          if (plVar11 < plVar1) {
            if (plVar11 == (long *)local_c8.ilowest) break;
            uVar16 = uVar16 >> 3 & 0x1fffffff;
            bVar18 = local_c8.ilowest <= (long *)((long)plVar11 - uVar16);
            uVar8 = (ulong)(uint)((int)plVar11 - iVar12);
            if (bVar18) {
              uVar8 = uVar16;
            }
            uVar14 = uVar14 + (int)uVar8 * -8;
          }
          else {
            uVar8 = uVar16 >> 3 & 0x1fffffff;
            uVar14 = uVar14 & 7;
            bVar18 = true;
          }
          uVar16 = (ulong)uVar14;
          plVar11 = (long *)((long)plVar11 - uVar8);
          lVar10 = *plVar11;
          if (((BYTE *)((long)dst + -2) < pBVar17) || (!bVar18)) break;
          uVar8 = (ulong)(lVar10 << (uVar16 & 0x3f)) >> 0x35;
          *(short *)pBVar17 = (short)DTable[uVar8 + 1];
          pBVar17 = pBVar17 + *(byte *)((long)DTable + uVar8 * 4 + 7);
          uVar16 = (ulong)(*(byte *)((long)DTable + uVar8 * 4 + 6) + uVar14);
        }
        for (; pBVar17 <= (BYTE *)((long)dst + -2);
            pBVar17 = pBVar17 + *(byte *)((long)DTable + uVar8 * 4 + 7)) {
          uVar8 = (ulong)(lVar10 << (uVar16 & 0x3f)) >> 0x35;
          *(short *)pBVar17 = (short)DTable[uVar8 + 1];
          uVar16 = (ulong)((uint)*(byte *)((long)DTable + uVar8 * 4 + 6) + (int)uVar16);
        }
      }
      if (pBVar17 < dst) {
        *pBVar17 = (BYTE)DTable[((ulong)(lVar10 << (uVar16 & 0x3f)) >> 0x35) + 1];
        pBVar17 = pBVar17 + 1;
      }
      pBVar3 = local_c8.op[lVar9];
      local_c8.op[lVar9] = pBVar17 + ((long)pBVar3 - (long)pBVar2);
      if (pBVar17 + ((long)pBVar3 - (long)pBVar2) != (BYTE *)dst) {
        return 0xffffffffffffffec;
      }
      lVar9 = lVar9 + 1;
      if (lVar9 == 4) {
        return dstSize;
      }
    }
  }
  return local_e8;
}

Assistant:

static HUF_FAST_BMI2_ATTRS size_t
HUF_decompress4X2_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn) {
    void const* dt = DTable + 1;
    const BYTE* const ilowest = (const BYTE*)cSrc;
    BYTE* const oend = ZSTD_maybeNullPtrAdd((BYTE*)dst, dstSize);
    HUF_DecompressFastArgs args;
    {
        size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init asm args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilowest);
    loopFn(&args);

    /* note : op4 already verified within main loop */
    assert(args.ip[0] >= ilowest);
    assert(args.ip[1] >= ilowest);
    assert(args.ip[2] >= ilowest);
    assert(args.ip[3] >= ilowest);
    assert(args.op[3] <= oend);

    assert(ilowest == args.ilowest);
    assert(ilowest + 6 == args.iend[0]);
    (void)ilowest;

    /* finish bitStreams one by one */
    {
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            args.op[i] += HUF_decodeStreamX2(args.op[i], &bit, segmentEnd, (HUF_DEltX2 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd)
                return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    return dstSize;
}